

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O3

int __thiscall clunk::Node::KnightEval<false>(Node *this,uint8_t (*fileInfo) [10])

{
  byte bVar1;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  
  if (fileInfo == (uint8_t (*) [10])0x0) {
    __assert_fail("fileInfo",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xd43,"int clunk::Node::KnightEval(const uint8_t (*)[10]) [color = false]");
  }
  uVar4 = (ulong)DAT_001688f0;
  iVar3 = 0;
  if (1 < (int)DAT_001688f0) {
    iVar3 = DAT_001688f0 * -0x10 + 0x10;
  }
  if (DAT_001688f0 != 0) {
    do {
      if ((int)uVar4 < 1) {
        __assert_fail("i >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xd4d,"int clunk::Node::KnightEval(const uint8_t (*)[10]) [color = false]");
      }
      bVar1 = (&DAT_00168837)[uVar4 * 2];
      if ((bVar1 & 0x88) != 0) {
        __assert_fail("IS_SQUARE(sqr)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xd4f,"int clunk::Node::KnightEval(const uint8_t (*)[10]) [color = false]");
      }
      uVar4 = uVar4 - 1;
      pcVar2 = (char *)(&_board)[bVar1];
      if (pcVar2 != &DAT_00168838 + uVar4 * 2) {
        __assert_fail("_board[sqr] == (_piece + KnightOffset + i + (10 * color))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xd50,"int clunk::Node::KnightEval(const uint8_t (*)[10]) [color = false]");
      }
      if (*pcVar2 != '\x04') {
        __assert_fail("_board[sqr]->type == (color|Knight)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xd51,"int clunk::Node::KnightEval(const uint8_t (*)[10]) [color = false]");
      }
      if (pcVar2[1] != bVar1) {
        __assert_fail("_board[sqr]->sqr == sqr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xd52,"int clunk::Node::KnightEval(const uint8_t (*)[10]) [color = false]");
      }
      if (DAT_001688ec != 0) {
        uVar6 = (ulong)(bVar1 & 7);
        iVar3 = iVar3 + (uint)(fileInfo[1][uVar6 + 2] == '\0' && fileInfo[1][uVar6] == '\0') * 4 +
                (uint)((byte)(bVar1 >> 4 | 0x10) == fileInfo[1][uVar6 + 1] && 0x2f < bVar1) * 4;
      }
      uVar7 = 0;
      uVar6 = *(ulong *)(_knightMoves + (ulong)bVar1 * 8);
      if (*(ulong *)(_knightMoves + (ulong)bVar1 * 8) == 0) {
        iVar8 = -0x10;
        iVar9 = 0;
      }
      else {
        do {
          if ((uVar6 & 0xff) != 0) {
            uVar5 = (int)(uVar6 & 0xff) - 1;
            if ((uVar5 & 0xffffff88) != 0) {
              __assert_fail("IS_SQUARE(to)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0xd64,
                            "int clunk::Node::KnightEval(const uint8_t (*)[10]) [color = false]");
            }
            if (uVar5 == bVar1) {
              __assert_fail("to != sqr",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0xd65,
                            "int clunk::Node::KnightEval(const uint8_t (*)[10]) [color = false]");
            }
            uVar7 = uVar7 + (*(byte *)(&_board)[uVar5] & 1 | *(byte *)(&_board)[uVar5] == 0);
          }
          bVar10 = 0xff < uVar6;
          uVar6 = uVar6 >> 8;
        } while (bVar10);
        if (8 < uVar7) {
          __assert_fail("(mob >= 0) & (mob <= 8)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0xd69,"int clunk::Node::KnightEval(const uint8_t (*)[10]) [color = false]")
          ;
        }
        iVar8 = (uint)(uVar7 != 0) * 0x10 + -0x10;
        iVar9 = (uint)(uVar7 != 1) * 4 + -4;
      }
      if (((_KING[1] & 0x88) != 0) || ((PTR_DAT_0015c338[1] & 0x88) != 0)) {
        __assert_fail("IS_SQUARE(to)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x100,"int clunk::Distance(const int, const int)");
      }
      iVar3 = ((iVar3 + uVar7 + iVar9 + iVar8) -
              ((int)(char)(&_dist)[(ulong)(byte)PTR_DAT_0015c338[1] + (ulong)bVar1 * 0x80] +
              (int)(char)(&_dist)[(ulong)(byte)_KING[1] + (ulong)bVar1 * 0x80])) + 8;
    } while (uVar4 != 0);
  }
  this->scoreType[4] = iVar3;
  this->scoreType[0x12] = this->scoreType[0x12] + iVar3;
  return iVar3;
}

Assistant:

int KnightEval(const uint8_t fileInfo[2][10]) {
    assert(fileInfo);
    assert((KnightOffset + 10) == BlackKnightOffset);
    int score = 0;

    // redundant knights are worth slightly less
    if (_pcount[color|Knight] > 1) {
      score -= (16 * (_pcount[color|Knight] - 1));
    }

    for (int i = _pcount[color|Knight]; i--; ) {
      assert(i >= 0);
      const int sqr = _piece[KnightOffset + i + (10 * color)].sqr;
      assert(IS_SQUARE(sqr));
      assert(_board[sqr] == (_piece + KnightOffset + i + (10 * color)));
      assert(_board[sqr]->type == (color|Knight));
      assert(_board[sqr]->sqr == sqr);

      const int x = XC(sqr);
      const int y = YC(sqr);
      if (_pcount[(!color)|Pawn]) {
        // bonus if can't be menaced by enemy pawns
        score += (4 * !(fileInfo[!color][x] | fileInfo[!color][x + 2]));

        // bonus if blocking a backward pawn
        score += (4 * (color ? (y < 5) : (y > 2)) *
                  (fileInfo[!color][x + 1] == (y + (color ? South : North))));
      }

      // mobility bonus/penalty
      int mob = 0;
      for (uint64_t mvs = _knightMoves[sqr]; mvs; mvs >>= 8) {
        if (mvs & 0xFF) {
          const int to = ((mvs & 0xFF) - 1);
          assert(IS_SQUARE(to));
          assert(to != sqr);
          mob += ((!_board[to]->type) | (COLOR(_board[to]->type) != color));
        }
      }
      assert((mob >= 0) & (mob <= 8));
      score += (mob - (16 * !mob) - (4 * (mob == 1)));

      // keep knights close to the kings
      score += (8 - (Distance(sqr, _KING[White]->sqr) +
                     Distance(sqr, _KING[Black]->sqr)));
    }

#ifndef NDEBUG
    scoreType[color|Knight] = score;
    scoreType[color|Total] += score;
#endif

    return score;
  }